

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O0

void __thiscall
re2c::If::used_labels
          (If *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_local;
  If *this_local;
  
  if (this->type == BINARY) {
    Binary::used_labels((this->info).binary,used);
  }
  else if (this->type == LINEAR) {
    Linear::used_labels((this->info).linear,used);
  }
  return;
}

Assistant:

void If::used_labels (std::set<label_t> & used)
{
	switch (type)
	{
		case BINARY:
			info.binary->used_labels (used);
			break;
		case LINEAR:
			info.linear->used_labels (used);
			break;
	}
}